

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

int run_test_poll_duplex(void)

{
  test_mode = 0;
  start_poll_test();
  return 0;
}

Assistant:

TEST_IMPL(poll_duplex) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#elif defined(__PASE__)
  RETURN_SKIP("API shutdown() may lead to timing issue on IBM i PASE");
#endif
  test_mode = DUPLEX;
  start_poll_test();
  return 0;
}